

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_event.cpp
# Opt level: O3

ssize_t __thiscall
cppurses::Delete_event::send(Delete_event *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Widget *pWVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  pointer ppWVar3;
  vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> local_38;
  
  pWVar1 = (this->super_Event).receiver_;
  uVar2 = (*pWVar1->_vptr_Widget[0x14])(pWVar1,CONCAT44(in_register_00000034,__fd));
  pWVar1 = (this->removed_)._M_t.
           super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
           super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
           super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
  if (pWVar1 != (Widget *)0x0) {
    Children_data::get_descendants(&local_38,&pWVar1->children);
    for (ppWVar3 = local_38.
                   super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppWVar3 !=
        local_38.super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>._M_impl
        .super__Vector_impl_data._M_finish; ppWVar3 = ppWVar3 + 1) {
      (*(*ppWVar3)->_vptr_Widget[0x14])();
    }
    if (local_38.super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pWVar1 = (this->removed_)._M_t.
             super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
             super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
             super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
    (this->removed_)._M_t.
    super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
    super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
    super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl = (Widget *)0x0;
    if (pWVar1 != (Widget *)0x0) {
      (*pWVar1->_vptr_Widget[1])();
    }
  }
  return (ulong)uVar2;
}

Assistant:

bool Delete_event::send() const {
    const auto result = receiver_.delete_event();
    if (removed_ == nullptr) {
        return result;
    }
    for (Widget* w : removed_->children.get_descendants()) {
        w->delete_event();
    }
    removed_.reset();
    return result;
}